

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O3

void __thiscall asl::SocketServer::start(SocketServer *this,bool nonblocking)

{
  SockServerThread *this_00;
  undefined7 in_register_00000031;
  
  this->_running = true;
  if ((int)CONCAT71(in_register_00000031,nonblocking) != 0) {
    this_00 = (SockServerThread *)operator_new(0x20);
    (this_00->super_Thread)._thread = 0;
    (this_00->super_Thread)._threadFinished = false;
    (this_00->super_Thread)._detached = false;
    (this_00->super_Thread)._vptr_Thread = (_func_int **)&PTR__Thread_00150910;
    this_00->_server = this;
    this->_thread = this_00;
    Thread::run((Thread *)this_00,Thread::begin,this_00);
    return;
  }
  startLoop(this);
  return;
}

Assistant:

void SocketServer::start(bool nonblocking)
{
	_running = true;

	if(nonblocking) {
		_thread = new SockServerThread(this);
		_thread->start();
	}
	else
		startLoop();
}